

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O2

void __thiscall MeshLib::Solid::readBYU(Solid *this,istream *is)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  double *pdVar5;
  tVertex pVVar6;
  int i;
  long lVar7;
  int local_950;
  int local_94c;
  int v [3];
  undefined4 uStack_92c;
  string str_1;
  string s_1;
  string str;
  string_token_iterator iter;
  string s;
  string_token_iterator local_878;
  string_token_iterator iter_1;
  char line [2048];
  
  std::istream::getline((char *)is,(long)line);
  std::__cxx11::string::string((string *)&s,line,(allocator *)&iter);
  string_token_iterator::string_token_iterator(&iter,&s," \n");
  string_token_iterator::find_next(&iter);
  string_token_iterator::operator*[abi_cxx11_(&str,&iter);
  iVar2 = atoi(str._M_dataplus._M_p);
  string_token_iterator::find_next(&iter);
  string_token_iterator::operator*[abi_cxx11_(&s_1,&iter);
  std::__cxx11::string::operator=((string *)&str,(string *)&s_1);
  std::__cxx11::string::~string((string *)&s_1);
  std::istream::getline((char *)is,(long)line);
  local_950 = 1;
  local_94c = local_950;
  while (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 7) == 0) {
    plVar4 = (long *)std::istream::getline((char *)is,(long)line);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    if (line[0] != '\0') {
      std::__cxx11::string::string((string *)&s_1,line,(allocator *)&iter_1);
      string_token_iterator::string_token_iterator(&iter_1,&s_1," \n");
      str_1._M_dataplus._M_p = (pointer)&str_1.field_2;
      str_1._M_string_length = 0;
      str_1.field_2._M_local_buf[0] = '\0';
      if (iVar2 < local_950) {
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          string_token_iterator::operator*[abi_cxx11_((string *)&local_878,&iter_1);
          std::__cxx11::string::operator=((string *)&str_1,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          iVar3 = atoi(str_1._M_dataplus._M_p);
          v[lVar7] = iVar3;
          string_token_iterator::operator++(&local_878,&iter_1,0);
        }
        stack0xfffffffffffff6d0 = (double)CONCAT44(uStack_92c,-v[2]);
        createFace(this,v,local_94c);
        local_94c = local_94c + 1;
      }
      else {
        v[0] = 0;
        v[1] = 0;
        stack0xfffffffffffff6d0 = 0.0;
        for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
          string_token_iterator::operator*[abi_cxx11_((string *)&local_878,&iter_1);
          std::__cxx11::string::operator=((string *)&str_1,(string *)&local_878);
          std::__cxx11::string::~string((string *)&local_878);
          dVar1 = atof(str_1._M_dataplus._M_p);
          pdVar5 = Point::operator[]((Point *)v,iVar3);
          *pdVar5 = dVar1;
          string_token_iterator::operator++(&local_878,&iter_1,0);
        }
        pVVar6 = createVertex(this,local_950);
        (pVVar6->m_point).v[2] = 0.0;
        (pVVar6->m_point).v[0] = (double)v._0_8_;
        (pVVar6->m_point).v[1] = stack0xfffffffffffff6d0;
        pVVar6->m_id = local_950;
        local_950 = local_950 + 1;
      }
      std::__cxx11::string::~string((string *)&str_1);
      std::__cxx11::string::~string((string *)&s_1);
    }
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Solid::readBYU( std::istream & is )
{
	char line[MAX_LINE];

	is.getline(line, MAX_LINE);
	std::string s(line );
	string_token_iterator iter(s, " \n");
	std::string str = *(++iter);
	int vnum = atoi( str.c_str() );
	str = *(++iter);
//	int fnum = atoi( str.c_str() );
	is.getline(line, MAX_LINE);
	int vind, find;
	vind = find = 1;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		std::string str;

		if( vind <= vnum )
		{
			Point p;
			for( int i=0; i<3; i++ )
			{
				str = *iter;
				p[i] = atof( str.c_str() );
				iter++;
			}

			tVertex v = createVertex( vind );
			v->point() = p;
			v->id() = vind;
			vind ++;
		}
		else
		{
			int v[3];
			for( int i = 0; i < 3; i ++ )
			{
				str = *iter;
				v[i] = atoi( str.c_str() );
				iter++;
			}
			v[2] = -v[2];

			createFace( v, find );
			find ++;
		}
	}

	labelBoundaryEdges();

	removeDanglingVertices();

}